

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateClearFunctionImplementation
          (OneofGenerator *this,Printer *printer)

{
  Printer *printer_local;
  OneofGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message) {\n  GPBDescriptor *descriptor = [$owning_message_class$ descriptor];\n  GPBOneofDescriptor *oneof = [descriptor.oneofs objectAtIndex:$raw_index$];\n  GPBClearOneof(message, oneof);\n}\n"
                    );
  return;
}

Assistant:

void OneofGenerator::GenerateClearFunctionImplementation(io::Printer* printer) {
  printer->Print(
      variables_,
      "void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message) {\n"
      "  GPBDescriptor *descriptor = [$owning_message_class$ descriptor];\n"
      "  GPBOneofDescriptor *oneof = [descriptor.oneofs objectAtIndex:$raw_index$];\n"
      "  GPBClearOneof(message, oneof);\n"
      "}\n");
}